

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

GLFWbool waitForEvent(double *timeout)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  int *piVar5;
  uint64_t uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  timeval tv;
  fd_set fds;
  timeval local_d8;
  double local_c8;
  double dStack_c0;
  fd_set local_b8;
  
  iVar1 = *(int *)(_glfw.x11.display + 0x10);
  iVar9 = iVar1;
  if (iVar1 < _glfw.linjs.inotify) {
    iVar9 = _glfw.linjs.inotify;
  }
  iVar8 = iVar1 + 0x3f;
  if (-1 < iVar1) {
    iVar8 = iVar1;
  }
  do {
    while( true ) {
      local_b8.fds_bits[0xe] = 0;
      local_b8.fds_bits[0xf] = 0;
      local_b8.fds_bits[0xc] = 0;
      local_b8.fds_bits[0xd] = 0;
      local_b8.fds_bits[10] = 0;
      local_b8.fds_bits[0xb] = 0;
      local_b8.fds_bits[8] = 0;
      local_b8.fds_bits[9] = 0;
      local_b8.fds_bits[6] = 0;
      local_b8.fds_bits[7] = 0;
      local_b8.fds_bits[4] = 0;
      local_b8.fds_bits[5] = 0;
      local_b8.fds_bits[2] = 0;
      local_b8.fds_bits[3] = 0;
      local_b8.fds_bits[0] = 0;
      local_b8.fds_bits[1] = 0;
      local_b8.fds_bits[iVar8 >> 6] = local_b8.fds_bits[iVar8 >> 6] | 1L << ((byte)iVar1 & 0x3f);
      if (0 < _glfw.linjs.inotify) {
        local_b8.fds_bits[(uint)_glfw.linjs.inotify >> 6] =
             local_b8.fds_bits[(uint)_glfw.linjs.inotify >> 6] |
             1L << ((byte)_glfw.linjs.inotify & 0x3f);
      }
      if (timeout == (double *)0x0) break;
      local_d8.tv_sec = (__time_t)*timeout;
      local_d8.tv_usec = (__suseconds_t)((*timeout - (double)local_d8.tv_sec) * 1000000.0);
      uVar4 = _glfwPlatformGetTimerValue();
      iVar2 = select(iVar9 + 1,&local_b8,(fd_set *)0x0,(fd_set *)0x0,&local_d8);
      piVar5 = __errno_location();
      iVar3 = *piVar5;
      uVar6 = _glfwPlatformGetTimerValue();
      lVar7 = uVar6 - uVar4;
      auVar11._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar11._0_8_ = lVar7;
      auVar11._12_4_ = 0x45300000;
      dStack_c0 = auVar11._8_8_ - 1.9342813113834067e+25;
      local_c8 = dStack_c0 + ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
      uVar4 = _glfwPlatformGetTimerFrequency();
      auVar12._8_4_ = (int)(uVar4 >> 0x20);
      auVar12._0_8_ = uVar4;
      auVar12._12_4_ = 0x45300000;
      dVar10 = *timeout -
               local_c8 /
               ((auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0));
      *timeout = dVar10;
      if (0 < iVar2) {
        return 1;
      }
      if (iVar3 == 4 && iVar2 == -1) {
        return 0;
      }
      if (dVar10 <= 0.0) {
        return 0;
      }
    }
    iVar3 = select(iVar9 + 1,&local_b8,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
    if (iVar3 != -1) {
      return 1;
    }
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  return 1;
}

Assistant:

static GLFWbool waitForEvent(double* timeout)
{
    fd_set fds;
    const int fd = ConnectionNumber(_glfw.x11.display);
    int count = fd + 1;

#if defined(__linux__)
    if (_glfw.linjs.inotify > fd)
        count = _glfw.linjs.inotify + 1;
#endif
    for (;;)
    {
        FD_ZERO(&fds);
        FD_SET(fd, &fds);
#if defined(__linux__)
        if (_glfw.linjs.inotify > 0)
            FD_SET(_glfw.linjs.inotify, &fds);
#endif

        if (timeout)
        {
            const long seconds = (long) *timeout;
            const long microseconds = (long) ((*timeout - seconds) * 1e6);
            struct timeval tv = { seconds, microseconds };
            const uint64_t base = _glfwPlatformGetTimerValue();

            const int result = select(count, &fds, NULL, NULL, &tv);
            const int error = errno;

            *timeout -= (_glfwPlatformGetTimerValue() - base) /
                (double) _glfwPlatformGetTimerFrequency();

            if (result > 0)
                return GLFW_TRUE;
            if ((result == -1 && error == EINTR) || *timeout <= 0.0)
                return GLFW_FALSE;
        }
        else if (select(count, &fds, NULL, NULL, NULL) != -1 || errno != EINTR)
            return GLFW_TRUE;
    }
}